

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_d7297f::PathSimplifier::fillIndices(PathSimplifier *this)

{
  long lVar1;
  QPoint *w;
  qsizetype qVar2;
  Element **ppEVar3;
  long lVar4;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  Element *element;
  int i_1;
  int i;
  QPoint pts_1 [4];
  QPoint pts [3];
  uint *in_stack_ffffffffffffff68;
  Element *in_stack_ffffffffffffff70;
  Element *u;
  int iVar5;
  int iVar6;
  QPoint *u_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = 0;
  u_00 = in_RDI;
  while( true ) {
    w = (QPoint *)(long)iVar6;
    qVar2 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::size
                      ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)(in_RDI + 1)
                      );
    if (qVar2 <= (long)w) break;
    ppEVar3 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::at
                        ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                         (in_RDI + 1),(long)iVar6);
    *(ushort *)&(*ppEVar3)->field_0x38 = *(ushort *)&(*ppEVar3)->field_0x38 & 0xfeff;
    iVar6 = iVar6 + 1;
  }
  for (iVar5 = 0; lVar4 = (long)iVar5,
      qVar2 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::size
                        ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                         (in_RDI + 1)), lVar4 < qVar2; iVar5 = iVar5 + 1) {
    ppEVar3 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::at
                        ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                         (in_RDI + 1),(long)iVar5);
    u = *ppEVar3;
    if (((*(ushort *)&u->field_0x38 >> 8 & 1) == 0) && (u->next != (Element *)0x0)) {
      do {
        QDataBuffer<unsigned_int>::add
                  ((QDataBuffer<unsigned_int> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68)
        ;
        if (u->field_0x38 == '\x02') {
          QDataBuffer<QPoint>::at((QDataBuffer<QPoint> *)in_RDI[4],(ulong)u->indices[0]);
          QDataBuffer<QPoint>::at((QDataBuffer<QPoint> *)in_RDI[4],(ulong)u->indices[1]);
          QDataBuffer<QPoint>::at((QDataBuffer<QPoint> *)in_RDI[4],(ulong)u->indices[2]);
          subDivQuadratic((PathSimplifier *)CONCAT44(iVar6,iVar5),&u->middle,in_RDI,w);
        }
        else if (u->field_0x38 == '\x03') {
          QDataBuffer<QPoint>::at((QDataBuffer<QPoint> *)in_RDI[4],(ulong)u->indices[0]);
          QDataBuffer<QPoint>::at((QDataBuffer<QPoint> *)in_RDI[4],(ulong)u->indices[1]);
          QDataBuffer<QPoint>::at((QDataBuffer<QPoint> *)in_RDI[4],(ulong)u->indices[2]);
          QDataBuffer<QPoint>::at((QDataBuffer<QPoint> *)in_RDI[4],(ulong)u->indices[3]);
          subDivCubic((PathSimplifier *)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),u_00,
                      (QPoint *)CONCAT44(iVar6,iVar5),&u->middle,in_RDI);
        }
        *(ushort *)&u->field_0x38 = *(ushort *)&u->field_0x38 & 0xfeff | 0x100;
        in_stack_ffffffffffffff70 = u->next;
        u = in_stack_ffffffffffffff70;
        ppEVar3 = QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*>::at
                            ((QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *)
                             (in_RDI + 1),(long)iVar5);
      } while (in_stack_ffffffffffffff70 != *ppEVar3);
      in_stack_ffffffffffffffb4 = 0xffffffff;
      QDataBuffer<unsigned_int>::add
                ((QDataBuffer<unsigned_int> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PathSimplifier::fillIndices()
{
    for (int i = 0; i < m_elements.size(); ++i)
        m_elements.at(i)->processed = false;
    for (int i = 0; i < m_elements.size(); ++i) {
        Element *element = m_elements.at(i);
        if (element->processed || element->next == nullptr)
            continue;
        do {
            m_indices->add(element->indices[0]);
            switch (element->degree) {
            case Element::Quadratic:
                {
                    QPoint pts[] = {
                        m_points->at(element->indices[0]),
                        m_points->at(element->indices[1]),
                        m_points->at(element->indices[2])
                    };
                    subDivQuadratic(pts[0], pts[1], pts[2]);
                }
                break;
            case Element::Cubic:
                {
                    QPoint pts[] = {
                        m_points->at(element->indices[0]),
                        m_points->at(element->indices[1]),
                        m_points->at(element->indices[2]),
                        m_points->at(element->indices[3])
                    };
                    subDivCubic(pts[0], pts[1], pts[2], pts[3]);
                }
                break;
            default:
                break;
            }
            Q_ASSERT(element->next);
            element->processed = true;
            element = element->next;
        } while (element != m_elements.at(i));
        m_indices->add(Q_TRIANGULATE_END_OF_POLYGON);
    }
}